

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O1

BasicBlock * __thiscall
spvtools::opt::AggressiveDCEPass::GetHeaderBlock(AggressiveDCEPass *this,BasicBlock *blk)

{
  IRContext *this_00;
  StructuredCFGAnalysis *this_01;
  uint32_t uVar1;
  Instruction *pIVar2;
  BasicBlock *pBVar3;
  
  if (blk == (BasicBlock *)0x0) {
    blk = (BasicBlock *)0x0;
  }
  else {
    pIVar2 = BasicBlock::GetLoopMergeInst(blk);
    if (pIVar2 == (Instruction *)0x0) {
      this_00 = (this->super_MemPass).super_Pass.context_;
      if ((this_00->valid_analyses_ & kAnalysisStructuredCFG) == kAnalysisNone) {
        IRContext::BuildStructuredCFGAnalysis(this_00);
      }
      this_01 = (this_00->struct_cfg_analysis_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
                .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl;
      pIVar2 = (blk->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar1 = 0;
      if (pIVar2->has_result_id_ == true) {
        uVar1 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
      }
      uVar1 = StructuredCFGAnalysis::ContainingConstruct(this_01,uVar1);
      pBVar3 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,uVar1);
      return pBVar3;
    }
  }
  return blk;
}

Assistant:

BasicBlock* AggressiveDCEPass::GetHeaderBlock(BasicBlock* blk) const {
  if (blk == nullptr) {
    return nullptr;
  }

  BasicBlock* header_block = nullptr;
  if (blk->IsLoopHeader()) {
    header_block = blk;
  } else {
    uint32_t header =
        context()->GetStructuredCFGAnalysis()->ContainingConstruct(blk->id());
    header_block = context()->get_instr_block(header);
  }
  return header_block;
}